

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error_category.cpp
# Opt level: O0

string * __thiscall cppcms::impl::error_category::message_abi_cxx11_(error_category *this,int cat)

{
  int in_EDX;
  string *in_RDI;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15 [21];
  
  if (in_EDX == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"ok",local_15);
    std::allocator<char>::~allocator((allocator<char> *)local_15);
  }
  else if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"protocol violation",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"unknown",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return in_RDI;
}

Assistant:

std::string error_category::message(int cat) const
	{
		switch(cat) {
		case errc::ok: return "ok";
		case errc::protocol_violation: return "protocol violation";
		default:
			return "unknown";
		}
	}